

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O1

bool __thiscall rtosc::AutomationMgr::handleMidi(AutomationMgr *this,int channel,int type,int val)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  AutomationSlot *pAVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  
  if (((type - 0x26U < 0x3e) && ((0x3000000000000001U >> ((ulong)(type - 0x26U) & 0x3f) & 1) != 0))
     || (type == 6)) {
    setparameternumber(this,type,val);
    iVar1 = (this->NRPN).parhi;
    iVar14 = -1;
    iVar13 = -0x80;
    iVar15 = 0;
    if (iVar1 < 0) {
      iVar8 = -0x80;
      iVar9 = -1;
      bVar7 = false;
    }
    else {
      iVar2 = (this->NRPN).parlo;
      if (((iVar2 < 0) || (iVar8 = (this->NRPN).valhi, iVar8 < 0)) ||
         (iVar9 = (this->NRPN).vallo, iVar9 < 0)) {
        bVar7 = false;
        iVar8 = -0x80;
        iVar9 = -1;
      }
      else {
        iVar13 = iVar1 << 7;
        iVar8 = iVar8 << 7;
        bVar7 = true;
        iVar14 = iVar2;
      }
    }
    bVar5 = true;
    if (bVar7) {
      iVar15 = iVar14 + iVar13;
      bVar7 = true;
      if (this->nslots < 1) {
        bVar5 = true;
      }
      else {
        lVar12 = 0xc;
        lVar16 = 0;
        bVar6 = 0;
        do {
          if (*(int *)(this->slots->name + lVar12 + -0x14) == iVar15) {
            setSlot(this,(int)lVar16,(float)(iVar9 + iVar8) / 16383.0);
            bVar6 = 1;
          }
          lVar16 = lVar16 + 1;
          lVar12 = lVar12 + 0xa0;
        } while (lVar16 < this->nslots);
        bVar5 = (bool)(bVar6 ^ 1);
      }
    }
    if (!bVar5) {
      return true;
    }
  }
  else {
    iVar15 = channel * 0x80 + type;
    if (0 < this->nslots) {
      lVar12 = 8;
      lVar16 = 0;
      bVar7 = false;
      do {
        if (*(int *)(this->slots->name + lVar12 + -0x14) == iVar15) {
          setSlot(this,(int)lVar16,(float)val / 127.0);
          bVar7 = true;
        }
        lVar16 = lVar16 + 1;
        lVar12 = lVar12 + 0xa0;
      } while (lVar16 < this->nslots);
      if (bVar7) {
        return true;
      }
    }
    bVar7 = false;
  }
  uVar3 = this->nslots;
  if (0 < (long)(int)uVar3) {
    pAVar4 = this->slots;
    piVar10 = &pAVar4->learning;
    lVar12 = 0;
    do {
      if (*piVar10 == 1) {
        *piVar10 = -1;
        if (bVar7) {
          piVar10[2] = iVar15;
        }
        else {
          piVar10[1] = iVar15;
        }
        uVar11 = 1;
        if (1 < (int)uVar3) {
          uVar11 = (ulong)uVar3;
        }
        lVar16 = 0;
        do {
          if (1 < *(int *)(pAVar4->name + lVar16 + -0x10)) {
            *(int *)(pAVar4->name + lVar16 + -0x10) = *(int *)(pAVar4->name + lVar16 + -0x10) + -1;
          }
          lVar16 = lVar16 + 0xa0;
        } while (uVar11 * 0xa0 != lVar16);
        this->learn_queue_len = this->learn_queue_len + -1;
        setSlot(this,(int)lVar12,(float)val / 127.0);
        this->damaged = 1;
        return false;
      }
      lVar12 = lVar12 + 1;
      piVar10 = piVar10 + 0x28;
    } while ((int)uVar3 != lVar12);
  }
  return false;
}

Assistant:

bool AutomationMgr::handleMidi(int channel, int type, int val)
{
    bool is_nrpn = false;
    int par_id = 0;
    int value;
    if((type == C_dataentryhi) || (type == C_dataentrylo)
       || (type == C_nrpnhi) || (type == C_nrpnlo)) { //Process RPN and NRPN by the Master (ignore the chan)
        
        setparameternumber(type, val);

        int parhi = -1, parlo = -1, valhi = -1, vallo = -1;
        if(getnrpn(&parhi, &parlo, &valhi, &vallo) == 0){ //this is NRPN
            is_nrpn = true;
            par_id = (parhi<<7) + parlo;
            value = (valhi<<7) + vallo;
            bool bound_nrpn = false;
            for(int i=0; i<nslots; ++i) {
                if(slots[i].midi_nrpn == par_id) {
                    bound_nrpn = true;
                    setSlot(i, value/16383.0);
                }
            }

        if(bound_nrpn)
            return 1;
        }
        
    }
    else {
        
        par_id = channel*128 + type;

        bool bound_cc = false;
        for(int i=0; i<nslots; ++i) {
            if(slots[i].midi_cc == par_id) {
                bound_cc = true;
                setSlot(i, val/127.0);
            }
        }

        if(bound_cc)
            return 1;
        
    }

    //No bound CC, now to see if there's something to learn
    for(int i=0; i<nslots; ++i) {
        if(slots[i].learning == 1) {
            slots[i].learning = -1;
            if (is_nrpn)
                slots[i].midi_nrpn = par_id;
            else
                slots[i].midi_cc = par_id;
            for(int j=0; j<nslots; ++j)
                if(slots[j].learning > 1)
                    slots[j].learning -= 1;
            learn_queue_len--;
            setSlot(i, val/127.0);
            damaged = 1;
            break;
        }
    }
    return 0;
}